

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::CNegativeNoVAOArrays<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CNegativeNoVAOArrays<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CallLogWrapper *this_00;
  uint heightTest;
  uint widthRef;
  GLuint GVar1;
  GLenum GVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long _code;
  DIResult *this_01;
  allocator_type local_509;
  CColorArray coords;
  CColorArray bufferTest;
  undefined4 local_4c8;
  undefined4 local_4c4;
  undefined8 local_4c0;
  Vector<float,_4> local_4b8;
  CColorArray bufferRef;
  DIResult result;
  DILogger local_1a0;
  
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bufferRef,fixed_sample_locations_values + 1,(allocator<char> *)&bufferTest);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar1 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)&result,(string *)&bufferRef,
                     (string *)&coords,true);
  this->_program = GVar1;
  std::__cxx11::string::~string((string *)&coords);
  std::__cxx11::string::~string((string *)&bufferRef);
  std::__cxx11::string::~string((string *)&result);
  if (this->_program == 0) {
    result.status_ = -1;
  }
  else {
    this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
    ;
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DrawIndirectBase::PrimitiveGen(&this->super_DrawIndirectBase,4,8,8,&coords);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_buffer);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               coords.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    local_4c0 = 0;
    local_4c8 = (undefined4)
                ((ulong)((long)coords.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)coords.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
    local_4c4 = 1;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_bufferIndirect);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x14,&local_4c8,0x88e4);
    DIResult::DIResult(&result);
    glu::CallLogWrapper::glDrawArraysIndirect(this_00,4,(void *)0x0);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 != 0x502) {
      this_01 = &result;
      DIResult::error((DILogger *)&bufferRef,this_01);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&bufferRef,(char (*) [40])this_01);
      DILogger::~DILogger((DILogger *)&bufferRef);
    }
    uVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar3 & 0x300) == 0) {
      glu::CallLogWrapper::glDisableVertexAttribArray(this_00,0);
    }
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)CONCAT44(extraout_var,iVar4);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = *(int *)(CONCAT44(extraout_var_00,iVar5) + 4);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&bufferTest,0.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&bufferRef,(long)(iVar4 * iVar5),(value_type *)&bufferTest,
               (allocator_type *)&local_4b8);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)CONCAT44(extraout_var_01,iVar4);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = *(int *)(CONCAT44(extraout_var_02,iVar5) + 4);
    tcu::Vector<float,_4>::Vector(&local_4b8,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&bufferTest,(long)(iVar4 * iVar5),&local_4b8,&local_509);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)CONCAT44(extraout_var_03,iVar4);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::GL>
              (&this->super_DrawIndirectBase,0,0,iVar4,*(int *)(CONCAT44(extraout_var_04,iVar5) + 4)
               ,bufferTest.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    uVar3 = *(uint *)CONCAT44(extraout_var_05,iVar4);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    heightTest = *(uint *)(CONCAT44(extraout_var_06,iVar4) + 4);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    widthRef = *(uint *)CONCAT44(extraout_var_07,iVar4);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    _code = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,&bufferTest,uVar3,heightTest,&bufferRef,widthRef,
                       *(uint *)(CONCAT44(extraout_var_08,iVar4) + 4));
    DIResult::sub_result(&local_1a0,&result,_code);
    DILogger::~DILogger(&local_1a0);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&bufferTest.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&bufferRef.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    DILogger::~DILogger(&result.logger_);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&coords.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  }
  return result.status_;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(GL_TRIANGLES, 8, 8, coords);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawArraysIndirectCommand indirectArrays = { 0, 0, 0, 0 };
		indirectArrays.count					 = static_cast<GLuint>(coords.size());
		indirectArrays.primCount				 = 1;

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawElementsIndirectCommand), &indirectArrays, GL_STATIC_DRAW);

		DIResult result;
		glDrawArraysIndirect(GL_TRIANGLES, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver";
		}

		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
			glDisableVertexAttribArray(0);

		CColorArray bufferRef(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));
		CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(1.0f));

		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight(), &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight(), bufferRef, getWindowWidth(),
										 getWindowHeight()));

		return result.code();
	}